

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

size_t __thiscall
proto2_unittest::TestMutualRecursionA_SubGroup::ByteSizeLong(TestMutualRecursionA_SubGroup *this)

{
  int iVar1;
  anon_union_24_1_493b367e_for_TestMutualRecursionA_SubGroup_3 aVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  
  aVar2 = this->field_0;
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x3) == (undefined1  [24])0x0) {
    sVar5 = 0;
  }
  else {
    if (((undefined1  [24])aVar2 & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = TestMutualRecursionA_SubMessage::ByteSizeLong((this->field_0)._impl_.sub_message_);
      uVar3 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + (iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [24])aVar2 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      sVar4 = TestAllTypes::ByteSizeLong((this->field_0)._impl_.not_in_this_scc_);
      uVar3 = (uint)sVar4 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t TestMutualRecursionA_SubGroup::ByteSizeLong() const {
  const TestMutualRecursionA_SubGroup& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestMutualRecursionA.SubGroup)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // .proto2_unittest.TestMutualRecursionA.SubMessage sub_message = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.sub_message_);
    }
    // .proto2_unittest.TestAllTypes not_in_this_scc = 4;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.not_in_this_scc_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}